

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_lfiwax(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGTemp *ts;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o_5;
  uintptr_t o_6;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ts = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00bab804;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)(ret + (long)tcg_ctx_01),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00bab804;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00bab804:
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00),ret,(long)ctx->mem_idx,
             ctx->default_tcg_memop_mask | MO_LESL);
  if (ts != pTVar2) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)ts,(TCGArg)pTVar2);
  }
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)ts,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64
            (tcg_ctx_00,(TCGTemp *)((TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00) + (long)tcg_ctx_00))
  ;
  tcg_temp_free_internal_ppc64(tcg_ctx_00,ts);
  return;
}

Assistant:

static void gen_lfiwax(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    gen_qemu_ld32s(ctx, t0, EA);
    tcg_gen_ext_tl_i64(tcg_ctx, t1, t0);
    set_fpr(tcg_ctx, rD(ctx->opcode), t1);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}